

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractlistview.hpp
# Opt level: O2

void __thiscall
QtMWidgets::AbstractListView<QColor>::dataChanged(AbstractListView<QColor> *this,int first,int last)

{
  AbstractListViewPrivate<QColor> *this_00;
  
  this_00 = (AbstractListViewPrivate<QColor> *)
            (this->super_AbstractListViewBase).super_AbstractScrollArea.d.d;
  (**(code **)(*(long *)&(this->super_AbstractListViewBase).super_AbstractScrollArea + 0x1b8))();
  AbstractListViewPrivate<QColor>::updateIfNeeded(this_00,first,last);
  return;
}

Assistant:

void dataChanged( int first, int last ) override
	{
		AbstractListViewPrivate< T > * d = d_func();

		recalculateSize();

		d->updateIfNeeded( first, last );
	}